

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zeCommandListAppendMemoryRangesBarrier
          (ze_command_list_handle_t hCommandList,uint32_t numRanges,size_t *pRangeSizes,
          void **pRanges,ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,
          ze_event_handle_t *phWaitEvents)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  ze_result_t zVar6;
  ze_result_t result;
  ulong uVar7;
  undefined4 in_register_0000008c;
  undefined8 uVar8;
  ze_result_t unaff_R13D;
  ulong uVar9;
  bool bVar10;
  ze_result_t local_ac;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar4 = context;
  uVar8 = CONCAT44(in_register_0000008c,numWaitEvents);
  lVar2 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "zeCommandListAppendMemoryRangesBarrier(hCommandList, numRanges, pRangeSizes, pRanges, hSignalEvent, numWaitEvents, phWaitEventsLocal)"
             ,"");
  if (*(char *)(lVar2 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar2 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar3 = *(code **)(lVar4 + 0x250);
  if (pcVar3 == (code *)0x0) {
    zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar2 = *(long *)(lVar4 + 0xd30);
    lVar4 = *(long *)(lVar4 + 0xd38);
    uVar9 = lVar4 - lVar2 >> 3;
    bVar10 = lVar4 != lVar2;
    local_ac = unaff_R13D;
    if (bVar10) {
      uVar7 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar7 * 8);
        local_ac = (**(code **)(*plVar5 + 0x300))
                             (plVar5,hCommandList,numRanges,pRangeSizes,pRanges,hSignalEvent,uVar8,
                              phWaitEvents);
        if (local_ac != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier",local_ac);
          break;
        }
        bVar10 = uVar7 < uVar9;
        lVar1 = (-(ulong)(uVar9 == 0) - uVar9) + uVar7;
        uVar7 = uVar7 + 1;
        local_ac = unaff_R13D;
      } while (lVar1 != 0);
    }
    if (bVar10) {
      return local_ac;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar6 = ZEHandleLifetimeValidation::zeCommandListAppendMemoryRangesBarrierPrologue
                          (*(ZEHandleLifetimeValidation **)(context + 0xd48),hCommandList,numRanges,
                           pRangeSizes,pRanges,hSignalEvent,numWaitEvents,phWaitEvents),
       zVar6 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier",zVar6);
      return zVar6;
    }
    zVar6 = (*pcVar3)(hCommandList,numRanges,pRangeSizes,pRanges,hSignalEvent,uVar8,phWaitEvents);
    bVar10 = lVar4 != lVar2;
    if (bVar10) {
      uVar7 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar7 * 8);
        result = (**(code **)(*plVar5 + 0x308))
                           (plVar5,hCommandList,numRanges,pRangeSizes,pRanges,hSignalEvent,uVar8,
                            phWaitEvents,zVar6);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier",result);
          local_ac = result;
          break;
        }
        bVar10 = uVar7 < uVar9;
        lVar2 = uVar7 + (-(ulong)(uVar9 == 0) - uVar9);
        uVar7 = uVar7 + 1;
      } while (lVar2 != 0);
    }
    if (bVar10) {
      return local_ac;
    }
  }
  logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier",zVar6);
  return zVar6;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendMemoryRangesBarrier(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint32_t numRanges,                             ///< [in] number of memory ranges
        const size_t* pRangeSizes,                      ///< [in][range(0, numRanges)] array of sizes of memory range
        const void** pRanges,                           ///< [in][range(0, numRanges)] array of memory ranges
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before executing barrier;
                                                        ///< must be 0 if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before executing barrier
        )
    {
        context.logger->log_trace("zeCommandListAppendMemoryRangesBarrier(hCommandList, numRanges, pRangeSizes, pRanges, hSignalEvent, numWaitEvents, phWaitEventsLocal)");

        auto pfnAppendMemoryRangesBarrier = context.zeDdiTable.CommandList.pfnAppendMemoryRangesBarrier;

        if( nullptr == pfnAppendMemoryRangesBarrier )
            return logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListAppendMemoryRangesBarrierPrologue( hCommandList, numRanges, pRangeSizes, pRanges, hSignalEvent, numWaitEvents, phWaitEvents );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeCommandListAppendMemoryRangesBarrierPrologue( hCommandList, numRanges, pRangeSizes, pRanges, hSignalEvent, numWaitEvents, phWaitEvents );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier", result);
        }

        auto driver_result = pfnAppendMemoryRangesBarrier( hCommandList, numRanges, pRangeSizes, pRanges, hSignalEvent, numWaitEvents, phWaitEvents );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListAppendMemoryRangesBarrierEpilogue( hCommandList, numRanges, pRangeSizes, pRanges, hSignalEvent, numWaitEvents, phWaitEvents ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier", result);
        }

        return logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier", driver_result);
    }